

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int bcf_has_filter(bcf_hdr_t *hdr,bcf1_t *line,char *filter)

{
  int iVar1;
  int local_30;
  int i;
  int id;
  char *filter_local;
  bcf1_t *line_local;
  bcf_hdr_t *hdr_local;
  
  _i = filter;
  if ((*filter == '.') && (filter[1] == '\0')) {
    _i = "PASS";
  }
  iVar1 = bcf_hdr_id2int(hdr,0,_i);
  if ((iVar1 < 0) || (((hdr->id[0][iVar1].val)->info[0] & 0xf) == 0xf)) {
    hdr_local._4_4_ = -1;
  }
  else {
    if ((line->unpacked & 2U) == 0) {
      bcf_unpack(line,2);
    }
    if ((iVar1 == 0) && ((line->d).n_flt == 0)) {
      hdr_local._4_4_ = 1;
    }
    else {
      for (local_30 = 0; local_30 < (line->d).n_flt; local_30 = local_30 + 1) {
        if ((line->d).flt[local_30] == iVar1) {
          return 1;
        }
      }
      hdr_local._4_4_ = 0;
    }
  }
  return hdr_local._4_4_;
}

Assistant:

int bcf_has_filter(const bcf_hdr_t *hdr, bcf1_t *line, char *filter)
{
    if ( filter[0]=='.' && !filter[1] ) filter = "PASS";
    int id = bcf_hdr_id2int(hdr, BCF_DT_ID, filter);
    if ( !bcf_hdr_idinfo_exists(hdr,BCF_HL_FLT,id) ) return -1;  // not defined in the header

    if ( !(line->unpacked & BCF_UN_FLT) ) bcf_unpack(line, BCF_UN_FLT);
    if ( id==0 && !line->d.n_flt) return 1; // PASS

    int i;
    for (i=0; i<line->d.n_flt; i++)
        if ( line->d.flt[i]==id ) return 1;
    return 0;
}